

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                   *this,arrays_type *new_arrays_)

{
  value_type_pointer sv;
  group_type_pointer pgVar1;
  size_t sVar2;
  group_type_pointer pgVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  uint uVar6;
  ushort uVar7;
  char *pcVar8;
  size_t sVar9;
  undefined7 uVar10;
  uint64_t uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  group_type_pointer pgVar15;
  value_type_pointer ppVar16;
  uint uVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  ppVar16 = (this->arrays).elements_;
  if (ppVar16 != (value_type_pointer)0x0) {
    sVar2 = (this->arrays).groups_size_mask;
    pgVar3 = (this->arrays).groups_;
    if (pgVar3 != pgVar3 + sVar2 + 1) {
      pgVar15 = pgVar3;
      do {
        auVar19[0] = -(pgVar15->m[0].n == '\0');
        auVar19[1] = -(pgVar15->m[1].n == '\0');
        auVar19[2] = -(pgVar15->m[2].n == '\0');
        auVar19[3] = -(pgVar15->m[3].n == '\0');
        auVar19[4] = -(pgVar15->m[4].n == '\0');
        auVar19[5] = -(pgVar15->m[5].n == '\0');
        auVar19[6] = -(pgVar15->m[6].n == '\0');
        auVar19[7] = -(pgVar15->m[7].n == '\0');
        auVar19[8] = -(pgVar15->m[8].n == '\0');
        auVar19[9] = -(pgVar15->m[9].n == '\0');
        auVar19[10] = -(pgVar15->m[10].n == '\0');
        auVar19[0xb] = -(pgVar15->m[0xb].n == '\0');
        auVar19[0xc] = -(pgVar15->m[0xc].n == '\0');
        auVar19[0xd] = -(pgVar15->m[0xd].n == '\0');
        auVar19[0xe] = -(pgVar15->m[0xe].n == '\0');
        auVar19[0xf] = -(pgVar15->m[0xf].n == '\0');
        for (uVar17 = ((uint)(pgVar3 + sVar2 != pgVar15) << 0xe | 0x3fff) &
                      ~(uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(auVar19[0xf] >> 7) << 0xf); uVar17 != 0;
            uVar17 = uVar17 - 1 & uVar17) {
          uVar6 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          sv = ppVar16 + uVar6;
          uVar11 = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                   operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              this,&sv->first);
          uVar12 = uVar11 >> ((byte)new_arrays_->groups_size_index & 0x3f);
          lVar13 = 1;
          while( true ) {
            pgVar4 = new_arrays_->groups_;
            pgVar1 = pgVar4 + uVar12;
            auVar20[0] = -(pgVar1->m[0].n == '\0');
            auVar20[1] = -(pgVar1->m[1].n == '\0');
            auVar20[2] = -(pgVar1->m[2].n == '\0');
            auVar20[3] = -(pgVar1->m[3].n == '\0');
            auVar20[4] = -(pgVar1->m[4].n == '\0');
            auVar20[5] = -(pgVar1->m[5].n == '\0');
            auVar20[6] = -(pgVar1->m[6].n == '\0');
            auVar20[7] = -(pgVar1->m[7].n == '\0');
            auVar20[8] = -(pgVar1->m[8].n == '\0');
            auVar20[9] = -(pgVar1->m[9].n == '\0');
            auVar20[10] = -(pgVar1->m[10].n == '\0');
            auVar20[0xb] = -(pgVar1->m[0xb].n == '\0');
            auVar20[0xc] = -(pgVar1->m[0xc].n == '\0');
            auVar20[0xd] = -(pgVar1->m[0xd].n == '\0');
            auVar20[0xe] = -(pgVar1->m[0xe].n == '\0');
            auVar20[0xf] = -(pgVar1->m[0xf].n == '\0');
            uVar7 = (ushort)(SUB161(auVar20 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe;
            if (uVar7 == 0) {
              pgVar4[uVar12].m[0xf].n = pgVar4[uVar12].m[0xf].n | '\x01' << ((byte)uVar11 & 7);
            }
            else {
              uVar6 = 0;
              if (uVar7 != 0) {
                for (; (uVar7 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                }
              }
              uVar14 = (ulong)uVar6;
              ppVar5 = new_arrays_->elements_;
              pcVar8 = (sv->first)._M_str;
              ppVar5[uVar12 * 0xf + uVar14].first._M_len = (sv->first)._M_len;
              ppVar5[uVar12 * 0xf + uVar14].first._M_str = pcVar8;
              sVar9 = (sv->second).super_span<const_slang::parsing::Token,_18446744073709551615UL>.
                      _M_extent._M_extent_value;
              ppVar5[uVar12 * 0xf + uVar14].second.
              super_span<const_slang::parsing::Token,_18446744073709551615UL>._M_ptr =
                   (sv->second).super_span<const_slang::parsing::Token,_18446744073709551615UL>.
                   _M_ptr;
              ppVar5[uVar12 * 0xf + uVar14].second.
              super_span<const_slang::parsing::Token,_18446744073709551615UL>._M_extent.
              _M_extent_value = sVar9;
              uVar10 = *(undefined7 *)&(sv->second).field_0x11;
              ppVar5[uVar12 * 0xf + uVar14].second.isExpanded = (sv->second).isExpanded;
              *(undefined7 *)&ppVar5[uVar12 * 0xf + uVar14].second.field_0x11 = uVar10;
              pgVar4[uVar12].m[uVar14].n =
                   *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                               match_word(unsigned_long)::word + (uVar11 & 0xff));
            }
            if (uVar7 != 0) break;
            uVar12 = uVar12 + lVar13 & new_arrays_->groups_size_mask;
            lVar13 = lVar13 + 1;
          }
        }
        ppVar16 = ppVar16 + 0xf;
        bVar18 = pgVar3 + sVar2 != pgVar15;
        pgVar15 = pgVar15 + 1;
      } while (bVar18);
    }
  }
  delete_arrays(this,&this->arrays);
  sVar2 = new_arrays_->groups_size_index;
  sVar9 = new_arrays_->groups_size_mask;
  ppVar16 = new_arrays_->elements_;
  (this->arrays).groups_ = new_arrays_->groups_;
  (this->arrays).elements_ = ppVar16;
  (this->arrays).groups_size_index = sVar2;
  (this->arrays).groups_size_mask = sVar9;
  uVar12 = (this->arrays).groups_size_mask * 0xf + 0xe;
  if ((this->arrays).elements_ == (value_type_pointer)0x0) {
    uVar12 = 0;
  }
  uVar14 = (ulong)((float)uVar12 * 0.875);
  uVar14 = (long)((float)uVar12 * 0.875 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14;
  if (uVar12 < 0x1e) {
    uVar14 = uVar12;
  }
  (this->size_ctrl).ml = uVar14;
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }